

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  stbi_uc sVar1;
  int iVar2;
  undefined8 *puVar3;
  stbi_uc *psVar4;
  byte bVar5;
  stbi_uc *psVar6;
  stbi_uc *psVar7;
  uint uVar8;
  
  psVar7 = s->img_buffer;
  psVar4 = s->img_buffer_end;
  if (psVar7 < psVar4) {
    psVar6 = psVar7 + 1;
    s->img_buffer = psVar6;
    sVar1 = *psVar7;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_0011eaa2;
    psVar7 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar4 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar1 = '\0';
    }
    else {
      psVar4 = psVar7 + iVar2;
      sVar1 = *psVar7;
    }
    s->img_buffer_end = psVar4;
    psVar6 = s->buffer_start + 1;
    s->img_buffer = psVar6;
  }
  if (sVar1 == 'G') {
    if (psVar6 < psVar4) {
      psVar7 = psVar6 + 1;
      s->img_buffer = psVar7;
      sVar1 = *psVar6;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_0011eaa2;
      psVar7 = s->buffer_start;
      iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
      if (iVar2 == 0) {
        s->read_from_callbacks = 0;
        psVar4 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar1 = '\0';
      }
      else {
        psVar4 = psVar7 + iVar2;
        sVar1 = *psVar7;
      }
      s->img_buffer_end = psVar4;
      psVar7 = s->buffer_start + 1;
      s->img_buffer = psVar7;
    }
    if (sVar1 == 'I') {
      if (psVar7 < psVar4) {
        psVar6 = psVar7 + 1;
        s->img_buffer = psVar6;
        sVar1 = *psVar7;
      }
      else {
        if (s->read_from_callbacks == 0) goto LAB_0011eaa2;
        psVar7 = s->buffer_start;
        iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
        if (iVar2 == 0) {
          s->read_from_callbacks = 0;
          psVar4 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          sVar1 = '\0';
        }
        else {
          psVar4 = psVar7 + iVar2;
          sVar1 = *psVar7;
        }
        s->img_buffer_end = psVar4;
        psVar6 = s->buffer_start + 1;
        s->img_buffer = psVar6;
      }
      if (sVar1 == 'F') {
        if (psVar6 < psVar4) {
          psVar7 = psVar6 + 1;
          s->img_buffer = psVar7;
          sVar1 = *psVar6;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_0011eaa2;
          psVar7 = s->buffer_start;
          iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
          if (iVar2 == 0) {
            s->read_from_callbacks = 0;
            psVar4 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar1 = '\0';
          }
          else {
            psVar4 = psVar7 + iVar2;
            sVar1 = *psVar7;
          }
          s->img_buffer_end = psVar4;
          psVar7 = s->buffer_start + 1;
          s->img_buffer = psVar7;
        }
        if (sVar1 == '8') {
          if (psVar7 < psVar4) {
            psVar6 = psVar7 + 1;
            s->img_buffer = psVar6;
            sVar1 = *psVar7;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_0011eaa2;
            psVar7 = s->buffer_start;
            iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
            if (iVar2 == 0) {
              s->read_from_callbacks = 0;
              psVar4 = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
              sVar1 = '\0';
            }
            else {
              psVar4 = psVar7 + iVar2;
              sVar1 = *psVar7;
            }
            s->img_buffer_end = psVar4;
            psVar6 = s->buffer_start + 1;
            s->img_buffer = psVar6;
          }
          if ((sVar1 == '7') || (sVar1 == '9')) {
            if (psVar6 < psVar4) {
              s->img_buffer = psVar6 + 1;
              sVar1 = *psVar6;
            }
            else {
              if (s->read_from_callbacks == 0) goto LAB_0011eaa2;
              psVar4 = s->buffer_start;
              iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
              if (iVar2 == 0) {
                s->read_from_callbacks = 0;
                psVar7 = s->buffer_start + 1;
                s->buffer_start[0] = '\0';
                sVar1 = '\0';
              }
              else {
                psVar7 = psVar4 + iVar2;
                sVar1 = *psVar4;
              }
              s->img_buffer_end = psVar7;
              s->img_buffer = s->buffer_start + 1;
            }
            if (sVar1 == 'a') {
              puVar3 = (undefined8 *)__tls_get_addr(&PTR_0012de18);
              *puVar3 = "";
              iVar2 = stbi__get16le(s);
              g->w = iVar2;
              iVar2 = stbi__get16le(s);
              g->h = iVar2;
              psVar7 = s->img_buffer;
              psVar4 = s->img_buffer_end;
              if (psVar7 < psVar4) {
                s->img_buffer = psVar7 + 1;
                bVar5 = *psVar7;
                psVar7 = psVar7 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar5 = 0;
              }
              else {
                psVar7 = s->buffer_start;
                iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
                if (iVar2 == 0) {
                  s->read_from_callbacks = 0;
                  psVar4 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  bVar5 = 0;
                }
                else {
                  psVar4 = psVar7 + iVar2;
                  bVar5 = *psVar7;
                }
                s->img_buffer_end = psVar4;
                psVar7 = s->buffer_start + 1;
                s->img_buffer = psVar7;
              }
              g->flags = (uint)bVar5;
              if (psVar7 < psVar4) {
                s->img_buffer = psVar7 + 1;
                uVar8 = (uint)*psVar7;
                psVar7 = psVar7 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                uVar8 = 0;
              }
              else {
                psVar7 = s->buffer_start;
                iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar7,s->buflen);
                if (iVar2 == 0) {
                  s->read_from_callbacks = 0;
                  psVar4 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  uVar8 = 0;
                }
                else {
                  psVar4 = psVar7 + iVar2;
                  uVar8 = (uint)*psVar7;
                }
                s->img_buffer_end = psVar4;
                psVar7 = s->buffer_start + 1;
                s->img_buffer = psVar7;
              }
              g->bgindex = uVar8;
              if (psVar7 < psVar4) {
                s->img_buffer = psVar7 + 1;
                bVar5 = *psVar7;
              }
              else if (s->read_from_callbacks == 0) {
                bVar5 = 0;
              }
              else {
                psVar4 = s->buffer_start;
                iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar4,s->buflen);
                if (iVar2 == 0) {
                  s->read_from_callbacks = 0;
                  psVar7 = s->buffer_start + 1;
                  s->buffer_start[0] = '\0';
                  bVar5 = 0;
                }
                else {
                  psVar7 = psVar4 + iVar2;
                  bVar5 = *psVar4;
                }
                s->img_buffer_end = psVar7;
                s->img_buffer = s->buffer_start + 1;
              }
              g->ratio = (uint)bVar5;
              g->transparent = -1;
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              if (is_info != 0) {
                return 1;
              }
              bVar5 = (byte)g->flags;
              if (-1 < (char)bVar5) {
                return 1;
              }
              stbi__gif_parse_colortable(s,g->pal,2 << (bVar5 & 7),-1);
              return 1;
            }
          }
        }
      }
    }
  }
LAB_0011eaa2:
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_0012de18);
  *puVar3 = "not GIF";
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}